

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void testing::internal::PrintColorEncoded(char *str)

{
  char cVar1;
  GTestColor color_00;
  char *__beg;
  char *__end;
  undefined8 uVar2;
  long in_FS_OFFSET;
  char ch;
  allocator<char> local_49;
  char *local_48;
  char *p;
  char *pcStack_38;
  GTestColor color;
  char *str_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  p._4_4_ = COLOR_DEFAULT;
  pcStack_38 = str;
  while (__end = strchr(pcStack_38,0x40), __beg = pcStack_38, color_00 = p._4_4_, local_48 = __end,
        __end != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>((string *)&str_local,__beg,__end,&local_49);
    uVar2 = std::__cxx11::string::c_str();
    ColoredPrintf(color_00,"%s",uVar2);
    std::__cxx11::string::~string((string *)&str_local);
    std::allocator<char>::~allocator(&local_49);
    cVar1 = local_48[1];
    pcStack_38 = local_48 + 2;
    if (cVar1 == '@') {
      ColoredPrintf(p._4_4_,"@");
    }
    else if (cVar1 == 'D') {
      p._4_4_ = COLOR_DEFAULT;
    }
    else if (cVar1 == 'R') {
      p._4_4_ = COLOR_RED;
    }
    else if (cVar1 == 'G') {
      p._4_4_ = COLOR_GREEN;
    }
    else if (cVar1 == 'Y') {
      p._4_4_ = COLOR_YELLOW;
    }
    else {
      pcStack_38 = local_48 + 1;
    }
  }
  ColoredPrintf(p._4_4_,"%s",pcStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void PrintColorEncoded(const char* str) {
			GTestColor color = COLOR_DEFAULT;  // The current color.

											   // Conceptually, we split the string into segments divided by escape
											   // sequences.  Then we print one segment at a time.  At the end of
											   // each iteration, the str pointer advances to the beginning of the
											   // next segment.
			for (;;) {
				const char* p = strchr(str, '@');
				if (p == NULL) {
					ColoredPrintf(color, "%s", str);
					return;
				}

				ColoredPrintf(color, "%s", std::string(str, p).c_str());

				const char ch = p[1];
				str = p + 2;
				if (ch == '@') {
					ColoredPrintf(color, "@");
				}
				else if (ch == 'D') {
					color = COLOR_DEFAULT;
				}
				else if (ch == 'R') {
					color = COLOR_RED;
				}
				else if (ch == 'G') {
					color = COLOR_GREEN;
				}
				else if (ch == 'Y') {
					color = COLOR_YELLOW;
				}
				else {
					--str;
				}
			}
		}